

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::updateFileNameLabel(QFileDialogPrivate *this)

{
  Ui_QFileDialog *pUVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QString local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QFileDialogOptions::isLabelExplicitlySet((DialogLabel)(this->options).value.ptr);
  if (cVar2 == '\0') {
    iVar3 = QFileDialogOptions::fileMode();
    if (iVar3 == 2) {
      iVar3 = 0x6f4e22;
    }
    else {
      iVar3 = 0x6f4e2d;
    }
    QMetaObject::tr((char *)&local_28,(char *)&QFileDialog::staticMetaObject,iVar3);
  }
  else {
    QFileDialogOptions::labelText((DialogLabel)&local_28);
  }
  pUVar1 = (this->qFileDialogUi).d;
  if (pUVar1 != (Ui_QFileDialog *)0x0) {
    QLabel::setText(pUVar1->fileNameLabel,&local_28);
  }
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::updateFileNameLabel()
{
    if (options->isLabelExplicitlySet(QFileDialogOptions::FileName)) {
        setLabelTextControl(QFileDialog::FileName, options->labelText(QFileDialogOptions::FileName));
    } else {
        switch (q_func()->fileMode()) {
        case QFileDialog::Directory:
            setLabelTextControl(QFileDialog::FileName, QFileDialog::tr("Directory:"));
            break;
        default:
            setLabelTextControl(QFileDialog::FileName, QFileDialog::tr("File &name:"));
            break;
        }
    }
}